

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qthreadpool.cpp
# Opt level: O1

void __thiscall
QThreadPoolPrivate::stealAndRunRunnable(QThreadPoolPrivate *this,QRunnable *runnable)

{
  bool bVar1;
  
  bVar1 = QThreadPool::tryTake
                    ((QThreadPool *)(this->super_QObjectPrivate).super_QObjectData.q_ptr,runnable);
  if (bVar1) {
    bVar1 = runnable->m_autoDelete;
    (**runnable->_vptr_QRunnable)(runnable);
    if (bVar1 == true) {
      (*runnable->_vptr_QRunnable[2])(runnable);
      return;
    }
  }
  return;
}

Assistant:

void QThreadPoolPrivate::stealAndRunRunnable(QRunnable *runnable)
{
    Q_Q(QThreadPool);
    if (!q->tryTake(runnable))
        return;
    // If autoDelete() is false, runnable might already be deleted after run(), so check status now.
    const bool del = runnable->autoDelete();

    runnable->run();

    if (del)
        delete runnable;
}